

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_flip(void **param_1)

{
  bool bVar1;
  Roaring r1;
  Roaring r2;
  
  roaring::Roaring::Roaring(&r1);
  roaring::Roaring::flip(&r1,2,5);
  roaring::Roaring::bitmapOf(&r2,3,2,3,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x655);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,3,1,3,6);
  roaring::Roaring::flip(&r1,2,5);
  roaring::Roaring::bitmapOf(&r2,4,1,2,4,6);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x65c);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,2,1,3);
  roaring::Roaring::flip(&r1,0,5);
  roaring::Roaring::bitmapOf(&r2,3,0,2,4);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x663);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,2,1,3);
  roaring::Roaring::flip(&r1,1,3);
  roaring::Roaring::bitmapOf(&r2,2,2,3);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x66a);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,1,0xffffffffffffffff);
  roaring::Roaring::flip(&r1,0xffffffff,0x100000000);
  bVar1 = roaring::Roaring::isEmpty(&r1);
  _assert_true((ulong)bVar1,"r1.isEmpty()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x670);
  roaring::Roaring::~Roaring(&r1);
  roaring::Roaring::bitmapOf(&r1,2,2,3);
  roaring::Roaring::Roaring(&r2,&r1);
  roaring::Roaring::flip(&r1,2,2);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x677);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_flip) {
    {
        // flipping an empty map works as expected
        Roaring r1;
        r1.flip(2, 5);
        Roaring r2 = Roaring::bitmapOf(3, 2, 3, 4);
        assert_true(r1 == r2);
    }
    {
        // nothing is affected outside of the given range
        Roaring r1 = Roaring::bitmapOf(3, 1, 3, 6);
        r1.flip(2, 5);
        Roaring r2 = Roaring::bitmapOf(4, 1, 2, 4, 6);
        assert_true(r1 == r2);
    }
    {
        // given range can go outside of existing range
        Roaring r1 = Roaring::bitmapOf(2, 1, 3);
        r1.flip(0, 5);
        Roaring r2 = Roaring::bitmapOf(3, 0, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // range end is exclusive
        Roaring r1 = Roaring::bitmapOf(2, 1, 3);
        r1.flip(1, 3);
        Roaring r2 = Roaring::bitmapOf(2, 2, 3);
        assert_true(r1 == r2);
    }
    {
        // uint32 max can be flipped
        Roaring r1 = Roaring::bitmapOf(1, uint32_max);
        r1.flip(uint32_max, static_cast<uint64_t>(uint32_max) + 1);
        assert_true(r1.isEmpty());
    }
    {
        // empty range does nothing
        Roaring r1 = Roaring::bitmapOf(2, 2, 3);
        Roaring r2 = r1;
        r1.flip(2, 2);
        assert_true(r1 == r2);
    }
}